

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OStream *os,Header *header,int numThreads)

{
  void *pvVar1;
  OStream *os_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  Int64 IVar2;
  undefined8 in_RSI;
  Header *in_RDI;
  bool in_stack_00000017;
  OStream *in_stack_00000018;
  Header *in_stack_00000020;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_0000189e;
  undefined1 in_stack_0000189f;
  Header *in_stack_000018a0;
  OutputStreamMutex *in_stack_fffffffffffffdd0;
  OStream *in_stack_fffffffffffffdd8;
  GenericOutputFile *in_stack_fffffffffffffde0;
  DeepScanLineOutputFile *this_00;
  int in_stack_fffffffffffffe4c;
  Data *in_stack_fffffffffffffe50;
  
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  *(undefined ***)&(in_RDI->_map)._M_t._M_impl = &PTR__DeepScanLineOutputFile_00562a00;
  this_00 = (DeepScanLineOutputFile *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header;
  pvVar1 = operator_new(0x180);
  Data::Data(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  *(void **)&this_00->super_GenericOutputFile = pvVar1;
  os_00 = (OStream *)operator_new(0x38);
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdd0);
  *(OStream **)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x170) =
       os_00;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x178) = 0
  ;
  Header::sanityCheck(in_stack_000018a0,(bool)in_stack_0000189f,(bool)in_stack_0000189e);
  *(undefined8 *)
   (*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x170) + 0x28)
       = in_RSI;
  initialize(this_00,in_RDI);
  lineOffsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.
                                                             super__Rb_tree_header._M_header + 0x170
                                                  ) + 0x28) + 0x18))();
  *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
   (*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x170) + 0x30)
       = lineOffsets;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Header *)in_stack_fffffffffffffdd0
            );
  IVar2 = Header::writeTo(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  *(Int64 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x40) = IVar2;
  IVar2 = anon_unknown_6::writeLineOffsets(os_00,lineOffsets);
  *(Int64 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x120) = IVar2;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x3c) = 0;
  return;
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))
    
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = false;
    try
    {
        header.sanityCheck();
        _data->_streamData->os = &os;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition =
                _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
                writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
	_data->multipart=false;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data->_streamData;
        delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << os.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data->_streamData;
        delete _data;
        throw;
    }
}